

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperTree.c
# Opt level: O0

void Map_LibraryPrintTree(Map_SuperLib_t *pLib)

{
  float *pfVar1;
  Map_Super_t *pMVar2;
  char *pcVar3;
  undefined8 uVar4;
  int local_20;
  int local_1c;
  int k;
  int i;
  Map_Super_t *pGate;
  Map_SuperLib_t *pLib_local;
  
  for (local_1c = pLib->nVarsMax; local_1c < 0x14; local_1c = local_1c + 1) {
    pMVar2 = pLib->ppSupers[local_1c];
    printf("%6d  ",(ulong)(uint)pMVar2->Num);
    uVar4 = 0x20;
    if ((*(uint *)&pMVar2->field_0x4 & 1) != 0) {
      uVar4 = 0x2a;
    }
    printf("%c ",uVar4);
    pcVar3 = Mio_GateReadName(pMVar2->pRoot);
    printf("%6s",pcVar3);
    for (local_20 = 0; local_20 < (int)(*(uint *)&pMVar2->field_0x4 >> 2 & 7);
        local_20 = local_20 + 1) {
      printf(" %6d",(ulong)(uint)pMVar2->pFanins[local_20]->Num);
    }
    printf("  %s",pMVar2->pFormula);
    printf("\n");
    Extra_PrintBinary(_stdout,pMVar2->uTruth,0x40);
    printf("  %3d",(ulong)(*(uint *)&pMVar2->field_0x4 >> 5 & 7));
    printf("  %6.2f",(double)pMVar2->Area);
    printf("  (%4.2f, %4.2f)",(double)(pMVar2->tDelayMax).Rise,(double)(pMVar2->tDelayMax).Fall);
    printf("\n");
    for (local_20 = 0; local_20 < pLib->nVarsMax; local_20 = local_20 + 1) {
      if ((0.0 < pMVar2->tDelaysR[local_20].Rise || pMVar2->tDelaysR[local_20].Rise == 0.0) ||
         (pfVar1 = &pMVar2->tDelaysR[local_20].Fall, 0.0 < *pfVar1 || *pfVar1 == 0.0)) {
        pfVar1 = &pMVar2->tDelaysR[local_20].Fall;
        if (0.0 < *pfVar1 || *pfVar1 == 0.0) {
          if (0.0 < pMVar2->tDelaysR[local_20].Rise || pMVar2->tDelaysR[local_20].Rise == 0.0) {
            printf(" (%4.2f, %4.2f)",(double)pMVar2->tDelaysR[local_20].Rise,
                   (double)pMVar2->tDelaysR[local_20].Fall);
          }
          else {
            printf(" (----, %4.2f)",(double)pMVar2->tDelaysR[local_20].Fall);
          }
        }
        else {
          printf(" (%4.2f, ----)",(double)pMVar2->tDelaysR[local_20].Rise);
        }
      }
      else {
        printf(" (----, ----)");
      }
      if ((0.0 < pMVar2->tDelaysF[local_20].Rise || pMVar2->tDelaysF[local_20].Rise == 0.0) ||
         (pfVar1 = &pMVar2->tDelaysF[local_20].Fall, 0.0 < *pfVar1 || *pfVar1 == 0.0)) {
        pfVar1 = &pMVar2->tDelaysF[local_20].Fall;
        if (0.0 < *pfVar1 || *pfVar1 == 0.0) {
          if (0.0 < pMVar2->tDelaysF[local_20].Rise || pMVar2->tDelaysF[local_20].Rise == 0.0) {
            printf(" (%4.2f, %4.2f)",(double)pMVar2->tDelaysF[local_20].Rise,
                   (double)pMVar2->tDelaysF[local_20].Fall);
          }
          else {
            printf(" (----, %4.2f)",(double)pMVar2->tDelaysF[local_20].Fall);
          }
        }
        else {
          printf(" (%4.2f, ----)",(double)pMVar2->tDelaysF[local_20].Rise);
        }
      }
      else {
        printf(" (----, ----)");
      }
      printf("\n");
    }
    printf("\n");
  }
  return;
}

Assistant:

void Map_LibraryPrintTree( Map_SuperLib_t * pLib )
{
    Map_Super_t * pGate;
    int i, k;

    // print all the info related to the supergates
//    for ( i = pLib->nVarsMax; i < (int)pLib->nLines; i++ )
    for ( i = pLib->nVarsMax; i < 20; i++ )
    {
        pGate = pLib->ppSupers[i];

        // write the gate's fanin info and formula
        printf( "%6d  ", pGate->Num );
        printf( "%c ", pGate->fSuper? '*' : ' ' );
        printf( "%6s", Mio_GateReadName(pGate->pRoot) );
        for ( k = 0; k < (int)pGate->nFanins; k++ )
            printf( " %6d", pGate->pFanins[k]->Num );
        printf( "  %s", pGate->pFormula );
        printf( "\n" );

        // write the gate's derived info
        Extra_PrintBinary( stdout, pGate->uTruth, 64 );
        printf( "  %3d",   pGate->nGates );
        printf( "  %6.2f", pGate->Area );
        printf( "  (%4.2f, %4.2f)", pGate->tDelayMax.Rise, pGate->tDelayMax.Fall );
        printf( "\n" );
        for ( k = 0; k < pLib->nVarsMax; k++ )
        {
            // print the constraint on the rise of the gate in the form (D1, D2), 
            // where D1 is the constraint related to the rise of the k-th PI
            // where D2 is the constraint related to the fall of the k-th PI
            if ( pGate->tDelaysR[k].Rise < 0 && pGate->tDelaysR[k].Fall < 0 )
                printf( " (----, ----)" );
            else if ( pGate->tDelaysR[k].Fall < 0 )
                printf( " (%4.2f, ----)", pGate->tDelaysR[k].Rise );
            else if ( pGate->tDelaysR[k].Rise < 0 )
                printf( " (----, %4.2f)", pGate->tDelaysR[k].Fall );
            else
                printf( " (%4.2f, %4.2f)", pGate->tDelaysR[k].Rise, pGate->tDelaysR[k].Fall );

            // print the constraint on the fall of the gate in the form (D1, D2), 
            // where D1 is the constraint related to the rise of the k-th PI
            // where D2 is the constraint related to the fall of the k-th PI
            if ( pGate->tDelaysF[k].Rise < 0 && pGate->tDelaysF[k].Fall < 0 )
                printf( " (----, ----)" );
            else if ( pGate->tDelaysF[k].Fall < 0 )
                printf( " (%4.2f, ----)", pGate->tDelaysF[k].Rise );
            else if ( pGate->tDelaysF[k].Rise < 0 )
                printf( " (----, %4.2f)", pGate->tDelaysF[k].Fall );
            else
                printf( " (%4.2f, %4.2f)", pGate->tDelaysF[k].Rise, pGate->tDelaysF[k].Fall );
            printf( "\n" );
        }
        printf( "\n" );
    }
}